

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.hpp
# Opt level: O3

void __thiscall duckdb::JoinCondition::~JoinCondition(JoinCondition *this)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var2;
  pointer *__ptr;
  
  _Var1._M_head_impl =
       (this->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  (this->right).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  _Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>;
  if (_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8)
    )();
  }
  (this->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false> =
       (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0;
  return;
}

Assistant:

JoinCondition() {
	}